

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::read_next
          (basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
          error_code *ec)

{
  basic_json_parser<char,_std::allocator<char>_> *this_00;
  parse_state pVar1;
  int iVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  char_type *pcVar4;
  char_type *pcVar5;
  char cVar6;
  span<const_char,_18446744073709551615UL> sVar7;
  
  pbVar3 = (this->source_).source_.stream_ptr_;
  if (((&pbVar3->field_0x20)[(long)pbVar3->_vptr_basic_istream[-3]] & 1) != 0) {
    std::error_code::operator=(ec,source_error);
    return;
  }
  this_00 = &this->parser_;
  basic_json_parser<char,_std::allocator<char>_>::reset(this_00);
  do {
    if ((this->parser_).more_ != true) goto LAB_00364966;
    if ((this->parser_).input_ptr_ == (this->parser_).end_input_) {
      sVar7 = json_source_adaptor<jsoncons::stream_source<char>_>::read_buffer(&this->source_,ec);
      pcVar5 = sVar7.data_;
      iVar2 = ec->_M_value;
      if (sVar7.size_ != 0 && iVar2 == 0) {
        (this->parser_).begin_input_ = pcVar5;
        (this->parser_).end_input_ = pcVar5 + sVar7.size_;
        (this->parser_).input_ptr_ = pcVar5;
      }
      if (iVar2 != 0) {
        return;
      }
    }
    pcVar5 = (this->parser_).input_ptr_;
    pcVar4 = (this->parser_).end_input_;
    basic_json_parser<char,_std::allocator<char>_>::parse_some_(this_00,this->visitor_,ec);
    cVar6 = ec->_M_value != 0;
    if (pcVar5 == pcVar4 && !(bool)cVar6) {
      pVar1 = (this->parser_).state_;
      cVar6 = '\x03';
      if (pVar1 != start) {
        cVar6 = '\0';
        if ((pVar1 != accept) && (cVar6 = '\0', ((this->parser_).done_ & 1U) == 0)) {
          cVar6 = '\x01';
          std::error_code::operator=(ec,unexpected_eof);
        }
      }
    }
  } while (cVar6 == '\0');
  if (cVar6 != '\x01') {
LAB_00364966:
    basic_json_parser<char,_std::allocator<char>_>::skip_whitespace(this_00);
    do {
      if (((this->source_).source_.buffer_length_ == 0) &&
         (pbVar3 = (this->source_).source_.stream_ptr_,
         ((&pbVar3->field_0x20)[(long)pbVar3->_vptr_basic_istream[-3]] & 2) != 0)) {
        return;
      }
      basic_json_parser<char,_std::allocator<char>_>::skip_whitespace(this_00);
      if ((this->parser_).input_ptr_ != (this->parser_).end_input_) {
        return;
      }
      sVar7 = json_source_adaptor<jsoncons::stream_source<char>_>::read_buffer(&this->source_,ec);
      pcVar5 = sVar7.data_;
      iVar2 = ec->_M_value;
      if (sVar7.size_ != 0 && iVar2 == 0) {
        (this->parser_).begin_input_ = pcVar5;
        (this->parser_).end_input_ = pcVar5 + sVar7.size_;
        (this->parser_).input_ptr_ = pcVar5;
      }
    } while (iVar2 == 0);
  }
  return;
}

Assistant:

void read_next(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }        
            parser_.reset();
            while (!parser_.stopped())
            {
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                bool eof = parser_.source_exhausted();
                parser_.parse_some(visitor_, ec);
                if (JSONCONS_UNLIKELY(ec)) return;
                if (eof)
                {
                    if (parser_.enter())
                    {
                        break;
                    }
                    else if (!parser_.accept())
                    {
                        ec = json_errc::unexpected_eof;
                        return;
                    }
                }
            }
            
            parser_.skip_whitespace();
            while (!source_.eof())
            {
                parser_.skip_whitespace();
                if (parser_.source_exhausted())
                {
                    auto s = source_.read_buffer(ec);
                    if (JSONCONS_UNLIKELY(ec)) return;
                    if (s.size() > 0)
                    {
                        parser_.update(s.data(),s.size());
                    }
                }
                else
                {
                    break;
                }
            }
        }